

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

string * __thiscall
Cpu::lookup_abi_cxx11_(string *__return_storage_ptr__,Cpu *this,unsigned_short opc)

{
  ushort uVar1;
  ostream *poVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  allocator local_1e0 [32];
  string op;
  ostringstream outs;
  
  std::__cxx11::string::string((string *)&op,"",(allocator *)&outs);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&outs);
  if (opc == 0xfff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"unused",local_1e0);
    goto LAB_00102ae3;
  }
  uVar4 = (uint)opc;
  if ((uVar4 & 0xfe00) == 0xa00) {
    poVar2 = std::operator<<((ostream *)&outs,"jmp ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::operator<<(poVar2,uVar4 & 0x1ff);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&op,(string *)local_1e0);
    std::__cxx11::string::~string((string *)local_1e0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    uVar1 = opc >> 8;
    bVar3 = (byte)opc;
    if (uVar1 == 0xc) {
      poVar2 = std::operator<<((ostream *)&outs,"mov w, #");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<(poVar2,(uint)bVar3);
      std::__cxx11::stringbuf::str();
LAB_00102a87:
      std::__cxx11::string::operator=((string *)&op,(string *)local_1e0);
      std::__cxx11::string::~string((string *)local_1e0);
    }
    else {
      uVar5 = (uint)(opc >> 5);
      if (uVar5 == 1) {
        poVar2 = std::operator<<((ostream *)&outs,"mov ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::operator<<(poVar2,", w");
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar1 == 5) {
        poVar2 = std::operator<<((ostream *)&outs,"setb ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        poVar2 = std::operator<<(poVar2,".");
        std::ostream::operator<<(poVar2,uVar5 & 7);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 0xe) {
        poVar2 = std::operator<<((ostream *)&outs,"add w, ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 0xf) {
        poVar2 = std::operator<<((ostream *)&outs,"add ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::operator<<(poVar2,", w");
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar1 == 6) {
        poVar2 = std::operator<<((ostream *)&outs,"snb ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        poVar2 = std::operator<<(poVar2,".");
        std::ostream::operator<<(poVar2,uVar5 & 7);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 10) {
        poVar2 = std::operator<<((ostream *)&outs,"and w, ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 0xb) {
        poVar2 = std::operator<<((ostream *)&outs,"and ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::operator<<(poVar2,", w");
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar1 == 0xe) {
        poVar2 = std::operator<<((ostream *)&outs,"and w, #");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar2,(uint)bVar3);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 9) {
        poVar2 = std::operator<<((ostream *)&outs,"or ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::operator<<(poVar2,", w");
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 0x13) {
        poVar2 = std::operator<<((ostream *)&outs,"not ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar1 == 0xd) {
        poVar2 = std::operator<<((ostream *)&outs,"or w, #");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar2,(uint)bVar3);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 0xd) {
        poVar2 = std::operator<<((ostream *)&outs,"xor ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::operator<<(poVar2,", w");
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 0xc) {
        poVar2 = std::operator<<((ostream *)&outs,"xor w, ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 8) {
        poVar2 = std::operator<<((ostream *)&outs,"or w, ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar1 == 0xf) {
        poVar2 = std::operator<<((ostream *)&outs,"xor w, #");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar2,(uint)bVar3);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if (uVar5 == 3) {
        poVar2 = std::operator<<((ostream *)&outs,"clr ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar2,uVar4 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00102a87;
      }
      if ((opc != 0x40) && (uVar4 != 4)) {
        if (uVar5 == 7) {
          poVar2 = std::operator<<((ostream *)&outs,"dec ");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar2,uVar4 & 0x1f);
          std::__cxx11::stringbuf::str();
        }
        else if (uVar1 == 7) {
          poVar2 = std::operator<<((ostream *)&outs,"sb ");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
          poVar2 = std::operator<<(poVar2,".");
          std::ostream::operator<<(poVar2,uVar5 & 7);
          std::__cxx11::stringbuf::str();
        }
        else {
          switch(uVar5 - 5 >> 1 | (uint)((uVar5 - 5 & 1) != 0) << 0x1f) {
          case 0:
            poVar2 = std::operator<<((ostream *)&outs,"sub ");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
            std::operator<<(poVar2," w");
            std::__cxx11::stringbuf::str();
            break;
          default:
            if (uVar1 == 4) {
              poVar2 = std::operator<<((ostream *)&outs,"clrb ");
              *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                   *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
              poVar2 = std::operator<<(poVar2,".");
              std::ostream::operator<<(poVar2,uVar5 & 7);
              std::__cxx11::stringbuf::str();
            }
            else {
              switch(uVar5 - 4 >> 1 | (uint)((uVar5 - 4 & 1) != 0) << 0x1f) {
              case 0:
                poVar2 = std::operator<<((ostream *)&outs,"mov w, ");
                *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                     *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                std::operator<<(poVar2,"-w");
                std::__cxx11::stringbuf::str();
                break;
              case 1:
                poVar2 = std::operator<<((ostream *)&outs,"mov w, --");
                *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                     *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              default:
                if (opc == 0x42) {
                  poVar2 = std::operator<<((ostream *)&outs,"mov w, m");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,2);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar4 == 0x43) {
                  std::operator<<((ostream *)&outs,"mov m, w");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar5 == 0x1e) {
                  poVar2 = std::operator<<((ostream *)&outs,"movsz w, ++");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar5 == 0x16) {
                  poVar2 = std::operator<<((ostream *)&outs,"movsz w, --");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                  std::__cxx11::stringbuf::str();
                }
                else if ((uVar4 & 0xfffffff0) == 0x50) {
                  poVar2 = std::operator<<((ostream *)&outs,"mov m, #");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,uVar4 & 0xf);
                  std::__cxx11::stringbuf::str();
                }
                else if (opc == 2) {
                  std::operator<<((ostream *)&outs,"mov !option, w");
                  std::__cxx11::stringbuf::str();
                }
                else if ((ushort)(opc - 5) < 5) {
                  std::operator<<((ostream *)&outs,"mov !rx, w");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar5 == 0x11) {
                  poVar2 = std::operator<<((ostream *)&outs,"test ");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                  std::__cxx11::stringbuf::str();
                }
                else if (opc == 0) {
                  std::operator<<((ostream *)&outs,"nop");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar1 == 9) {
                  poVar2 = std::operator<<((ostream *)&outs,"call ");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,(uint)bVar3 | (*this->status & 0xffffffe0) << 4);
                  std::__cxx11::stringbuf::str();
                }
                else if (opc == 0xd) {
                  std::operator<<((ostream *)&outs,"retp");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar4 == 0xc) {
                  std::operator<<((ostream *)&outs,"ret");
                  std::__cxx11::stringbuf::str();
                }
                else if (opc >> 3 == 2) {
                  poVar2 = std::operator<<((ostream *)&outs,"page ");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,uVar4 & 7);
                  std::__cxx11::stringbuf::str();
                }
                else if (opc >> 3 == 3) {
                  poVar2 = std::operator<<((ostream *)&outs,"bank ");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,uVar4 & 7);
                  std::__cxx11::stringbuf::str();
                }
                else if (opc == 0xe) {
                  std::operator<<((ostream *)&outs,"not impl: reti");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar4 == 0xf) {
                  std::operator<<((ostream *)&outs,"not impl: retiw");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar4 == 0x41) {
                  std::operator<<((ostream *)&outs,"IREAD");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar1 == 8) {
                  poVar2 = std::operator<<((ostream *)&outs,"retw ");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,(uint)bVar3);
                  std::__cxx11::stringbuf::str();
                }
                else if (opc == 3) {
                  std::operator<<((ostream *)&outs,"SLEEP");
                  std::__cxx11::stringbuf::str();
                }
                else {
                  poVar2 = std::operator<<((ostream *)&outs,"not impl ");
                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar2,opc);
                  std::__cxx11::stringbuf::str();
                }
                break;
              case 6:
                poVar2 = std::operator<<((ostream *)&outs,"mov w, ");
                *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                     *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 7:
                poVar2 = std::operator<<((ostream *)&outs,"mov w, /");
                *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                     *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 8:
                poVar2 = std::operator<<((ostream *)&outs,"mov w, ++");
                *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                     *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 10:
                poVar2 = std::operator<<((ostream *)&outs,"mov w, <<");
                *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                     *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 0xb:
                poVar2 = std::operator<<((ostream *)&outs,"mov w, <<");
                *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                     *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar2,uVar4 & 0x1f);
                std::__cxx11::stringbuf::str();
              }
            }
            break;
          case 8:
            poVar2 = std::operator<<((ostream *)&outs,"inc ");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar2,uVar4 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 9:
            poVar2 = std::operator<<((ostream *)&outs,"decsz ");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar2,uVar4 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 10:
            poVar2 = std::operator<<((ostream *)&outs,"RR ");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar2,uVar4 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 0xb:
            poVar2 = std::operator<<((ostream *)&outs,"RL ");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar2,uVar4 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 0xc:
            poVar2 = std::operator<<((ostream *)&outs,"swap ");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar2,uVar4 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 0xd:
            poVar2 = std::operator<<((ostream *)&outs,"incsz ");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar2,uVar4 & 0x1f);
            std::__cxx11::stringbuf::str();
          }
        }
        goto LAB_00102a87;
      }
      std::__cxx11::string::assign((char *)&op);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p == &op.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(op.field_2._M_allocated_capacity._1_7_,op.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = op.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = op._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(op.field_2._M_allocated_capacity._1_7_,op.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = op._M_string_length;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  op._M_dataplus._M_p = (pointer)&op.field_2;
LAB_00102ae3:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outs);
  std::__cxx11::string::~string((string *)&op);
  return __return_storage_ptr__;
}

Assistant:

string Cpu::lookup(USHORT opc)
{
	string
	op = "";
	ostringstream outs;
	USHORT
	mne = opc;
	if (mne == 0xfff)
		return "unused";

	if (mne >> 9 == 0x5)
	{				//jmp
		outs << "jmp " << hex << (mne & 0x1ff);
		op = outs.str();
		return op;
	}
	else if (mne >> 8 == 0xc)
	{				//mov w,lit
		outs << "mov w, #" << hex << (mne & 0xff);
		op = outs.str();

	}
	else if (mne >> 5 == 1)
	{				//mov fr,w
		outs << "mov " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 8 == 5)
	{				//setb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "setb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 0xf)
	{				//add fr,w
		outs << "add " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 5 == 0xe)
	{				//add w,fr

		outs << "add w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 6)
	{				//snb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "snb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 11)
	{				//and fr,w
		outs << "and " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 5 == 10)
	{				//and w,fr
		outs << "and w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 0xe)
	{				//and w,#lit
		outs << "and w, #" << hex << (mne & 0xff);
		op = outs.str();

	}
	else if (mne >> 5 == 0x13)
	{				//not fr
		outs << "not " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 9)
	{				//or fr,w
		outs << "or " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 8 == 0xd)
	{				//or w,#lit
		outs << "or w, #" << hex << (mne & 0xff);
		op = outs.str();

	}
	else if (mne >> 5 == 8)
	{				//or w,fr
		outs << "or w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 13)
	{				//xor fr,w
		outs << "xor " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 5 == 12)
	{				//xor w,fr
		outs << "xor w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 0xf)
	{				//xor w,#lit
		outs << "xor w, #" << hex << (mne & 0xff);
		op = outs.str();

	}
	else if (mne >> 5 == 3)
	{				//clr fr
		outs << "clr " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne == 0x40)
	{				//clr w
		op = "clr w";
	}
	else if (mne == 4)
	{				//clr !WDT
		op = "clr !WDT";
	}
	else if (mne >> 5 == 7)
	{				//dec fr
		outs << "dec " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 7)
	{				//sb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "sb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 0x17)
	{				//decsz fr
		outs << "decsz " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x15)
	{				//inc fr
		outs << "inc " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x1f)
	{				//incsz fr
		outs << "incsz " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x1b)
	{				//RL fr

		outs << "RL " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x19)
	{				//RR fr
		outs << "RR " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 5)
	{				//sub fr,w
		outs << "sub " << hex << (mne & 0x1f) << " w";
		op = outs.str();

	}
	else if (mne >> 5 == 0x1d)
	{				//swap fr
		outs << "swap " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 4)
	{				//clrb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "clrb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 0x10)
	{				//mov w,fr
		outs << "mov w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x4)
	{				//mov w,fr-w
		outs << "mov w, " << hex << (mne & 0x1f) << "-w";
		op = outs.str();

	}
	else if (mne >> 5 == 0x12)
	{				//mov w,/fr (complement)
		outs << "mov w, /" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x6)
	{				//mov w,--fr
		outs << "mov w, --" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x14)
	{				//mov w,++fr
		outs << "mov w, ++" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x1a)
	{				//mov w,<<fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x18)
	{				//mov w,>>fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne == 0x43)
	{				//TODO: mov m,w
		outs << "mov m, w" ;
		op = outs.str();

	}
	else if (mne == 0x42)
	{				//TODO: mov w,m
		outs << "mov w, m" << hex << (mne & 0x1f);
		op = outs.str();

	}

	else if (mne >> 5 == 0x16)
	{				//movsz w,--fr
		outs << "movsz w, --" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x1e)
	{				//movsz w,++fr
		outs << "movsz w, ++" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne == 0x43)
	{ //mov m,w
		outs << "mov m, w";
		op = outs.str();

	}
	else if (mne >> 4 == 0x5)
	{ //mov m,#lit
		outs << "mov m, #" << hex << (mne&0xf);
		op = outs.str();

	}
	else if (mne == 0x2)
	{ //mov !option,w
		outs << "mov !option, w";
		op = outs.str();

	}
	else if (mne > 4 && mne < 10)
	{
		outs << "mov !rx, w";
		op = outs.str();

	}
	else if (mne == 2)
	{ //mov !option,w
		outs << "not impl: mov !option, w";
		op = outs.str();

	}

	else if (mne >> 5 == 0x11)
	{				//test fr
		outs << "test " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne == 0)
	{				//nop
		outs << "nop";
		op = outs.str();

	}
	else if (mne >> 8 == 9)
	{ //call addr8
		outs << "call " << hex << ((*status & 0xe0) << 4 | mne & 0xff);
		op = outs.str();

	}
	else if (mne == 0xc)
	{ //ret
		outs << "ret";
		op = outs.str();
	}
	else if (mne == 0xd)
	{ //retp
		outs << "retp";
		op = outs.str();

	}
	else if (mne >> 3 == 3)
	{ //bank addr12
		outs << "bank " << hex << (mne&7);
		op = outs.str();

	}
	else if (mne >> 3 == 2)
	{ //page addr12
		outs << "page " << hex << (mne&7);
		op = outs.str();

	}
	else if (mne == 0x41)
	{ //IREAD
		outs << "IREAD";
		op = outs.str();
	}
	else if (mne == 0xe)
	{ //TODO: reti
		outs << "not impl: reti";
		op = outs.str();
	}
	else if (mne == 0xf)
	{ //TODO: retiw
		outs << "not impl: retiw";
		op = outs.str();
	}
	else if (mne >> 8 == 8)
	{ //retw #lit
		outs << "retw " << hex << (mne&0xff);
		op = outs.str();
	}
	else if (mne == 3)
	{ //TODO: SLEEP
		outs << "SLEEP";
		op = outs.str();
	}



	else
	{
		outs << "not impl " << hex << mne;
		op = outs.str();
	}
	return op;

}